

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngerror.c
# Opt level: O0

size_t png_safecat(png_charp buffer,size_t bufsize,size_t pos,png_const_charp string)

{
  char *local_28;
  png_const_charp string_local;
  size_t pos_local;
  size_t bufsize_local;
  png_charp buffer_local;
  
  string_local = (png_const_charp)pos;
  if ((buffer != (png_charp)0x0) && (pos < bufsize)) {
    local_28 = string;
    if (string != (png_const_charp)0x0) {
      while (*local_28 != '\0' && string_local < (png_const_charp)(bufsize - 1)) {
        buffer[(long)string_local] = *local_28;
        local_28 = local_28 + 1;
        string_local = string_local + 1;
      }
    }
    buffer[(long)string_local] = '\0';
  }
  return (size_t)string_local;
}

Assistant:

size_t
png_safecat(png_charp buffer, size_t bufsize, size_t pos,
    png_const_charp string)
{
   if (buffer != NULL && pos < bufsize)
   {
      if (string != NULL)
         while (*string != '\0' && pos < bufsize-1)
           buffer[pos++] = *string++;

      buffer[pos] = '\0';
   }

   return pos;
}